

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void * __thiscall
google::protobuf::Reflection::MutableRawRepeatedField
          (Reflection *this,Message *message,FieldDescriptor *field,CppType cpptype,int ctype,
          Descriptor *desc)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  int iVar4;
  Descriptor *pDVar5;
  RepeatedPtrFieldBase *pRVar6;
  CppType in_ECX;
  FieldDescriptor *in_RDX;
  FieldDescriptor *in_RSI;
  Descriptor *in_RDI;
  undefined4 in_R8D;
  Descriptor *in_R9;
  Descriptor *unaff_retaddr;
  FieldDescriptor *in_stack_00000050;
  bool in_stack_0000005a;
  FieldType in_stack_0000005b;
  int in_stack_0000005c;
  ExtensionSet *in_stack_00000060;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  Reflection *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  LogLevel_conflict in_stack_ffffffffffffff5c;
  Reflection *in_stack_ffffffffffffff60;
  CppType expected_type;
  FieldDescriptor *in_stack_fffffffffffffff8;
  
  LVar2 = FieldDescriptor::label(in_RDX);
  if (LVar2 != LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (in_RDI,in_RSI,(char *)in_RDX,(char *)CONCAT44(in_ECX,in_R8D));
  }
  expected_type = (CppType)((ulong)in_RSI >> 0x20);
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x42bec5);
  if ((CVar3 != in_ECX) &&
     ((CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x42bedb), CVar3 != CPPTYPE_ENUM ||
      (in_ECX != CPPTYPE_INT32)))) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (unaff_retaddr,in_stack_fffffffffffffff8,(char *)in_RDI,expected_type);
  }
  if ((in_R9 != (Descriptor *)0x0) &&
     (pDVar5 = FieldDescriptor::message_type((FieldDescriptor *)in_stack_ffffffffffffff50),
     pDVar5 != in_R9)) {
    internal::LogMessage::LogMessage
              ((LogMessage *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
               (char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    internal::LogMessage::operator<<
              ((LogMessage *)in_stack_ffffffffffffff50,
               (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    in_stack_ffffffffffffff60 =
         (Reflection *)
         internal::LogMessage::operator<<
                   ((LogMessage *)in_stack_ffffffffffffff50,
                    (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_ffffffffffffff50,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    internal::LogMessage::~LogMessage((LogMessage *)0x42bfb8);
  }
  bVar1 = FieldDescriptor::is_extension(in_RDX);
  if (bVar1) {
    MutableExtensionSet(in_stack_ffffffffffffff50,
                        (Message *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    iVar4 = FieldDescriptor::number(in_RDX);
    FieldDescriptor::type((FieldDescriptor *)in_stack_ffffffffffffff60);
    FieldDescriptor::is_packed((FieldDescriptor *)CONCAT44(iVar4,in_stack_ffffffffffffff58));
    pRVar6 = (RepeatedPtrFieldBase *)
             internal::ExtensionSet::MutableRawRepeatedField
                       (in_stack_00000060,in_stack_0000005c,in_stack_0000005b,in_stack_0000005a,
                        in_stack_00000050);
  }
  else {
    bVar1 = anon_unknown_0::IsMapFieldInApi((FieldDescriptor *)0x42c073);
    if (bVar1) {
      MutableRawNonOneof<google::protobuf::internal::MapFieldBase>
                (in_stack_ffffffffffffff60,
                 (Message *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 (FieldDescriptor *)in_stack_ffffffffffffff50);
      pRVar6 = internal::MapFieldBase::MutableRepeatedField
                         ((MapFieldBase *)in_stack_ffffffffffffff50);
    }
    else {
      pRVar6 = (RepeatedPtrFieldBase *)
               MutableRawNonOneof<void>
                         (in_stack_ffffffffffffff60,
                          (Message *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                          (FieldDescriptor *)in_stack_ffffffffffffff50);
    }
  }
  return pRVar6;
}

Assistant:

void* Reflection::MutableRawRepeatedField(Message* message,
                                          const FieldDescriptor* field,
                                          FieldDescriptor::CppType cpptype,
                                          int ctype,
                                          const Descriptor* desc) const {
  USAGE_CHECK_REPEATED("MutableRawRepeatedField");
  if (field->cpp_type() != cpptype &&
      (field->cpp_type() != FieldDescriptor::CPPTYPE_ENUM ||
       cpptype != FieldDescriptor::CPPTYPE_INT32))
    ReportReflectionUsageTypeError(descriptor_, field,
                                   "MutableRawRepeatedField", cpptype);
  if (desc != nullptr)
    GOOGLE_CHECK_EQ(field->message_type(), desc) << "wrong submessage type";
  if (field->is_extension()) {
    return MutableExtensionSet(message)->MutableRawRepeatedField(
        field->number(), field->type(), field->is_packed(), field);
  } else {
    // Trigger transform for MapField
    if (IsMapFieldInApi(field)) {
      return MutableRawNonOneof<MapFieldBase>(message, field)
          ->MutableRepeatedField();
    }
    return MutableRawNonOneof<void>(message, field);
  }
}